

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

void telnet_send(Backend *be,char *buf,size_t len)

{
  Interactor *pIVar1;
  char *pcVar2;
  uchar *puVar3;
  char *pcVar4;
  
  if ((be[-10].vt != (BackendVtable *)0x0) && (0 < (long)len)) {
    pcVar2 = buf + len;
    pcVar4 = buf;
LAB_0013afa0:
    do {
      if (*pcVar4 != -1) {
        if (((*pcVar4 != '\r') || (*(int *)&be[-5].interactor == 1)) &&
           (pcVar4 = pcVar4 + 1, pcVar4 < pcVar2)) goto LAB_0013afa0;
      }
      pIVar1 = (Interactor *)
               (**(code **)((be[-10].vt)->init + 0x10))(be[-10].vt,buf,(long)pcVar4 - (long)buf);
      be[-4].interactor = pIVar1;
      for (buf = pcVar4; buf < pcVar2; buf = buf + 1) {
        puVar3 = telnet_send::iac;
        if ((*buf != -1) && ((*buf != '\r' || (puVar3 = "\r", *(int *)&be[-5].interactor == 1))))
        break;
        pIVar1 = (Interactor *)(**(code **)((be[-10].vt)->init + 0x10))(be[-10].vt,puVar3,2);
        be[-4].interactor = pIVar1;
      }
      pcVar4 = buf;
    } while (buf < pcVar2);
  }
  return;
}

Assistant:

static void telnet_send(Backend *be, const char *buf, size_t len)
{
    Telnet *telnet = container_of(be, Telnet, backend);
    unsigned char *p, *end;
    static const unsigned char iac[2] = { IAC, IAC };
    static const unsigned char cr[2] = { CR, NUL };
#if 0
    static const unsigned char nl[2] = { CR, LF };
#endif

    if (telnet->s == NULL)
        return;

    p = (unsigned char *)buf;
    end = (unsigned char *)(buf + len);
    while (p < end) {
        unsigned char *q = p;

        while (p < end && iswritable(*p))
            p++;
        telnet->bufsize = sk_write(telnet->s, q, p - q);

        while (p < end && !iswritable(*p)) {
            telnet->bufsize =
                sk_write(telnet->s, *p == IAC ? iac : cr, 2);
            p++;
        }
    }
}